

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt_num.c
# Opt level: O0

uint32_t nd_div2k(uint32_t *nd,uint32_t ndhi,uint32_t k,SFormat sf)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  uint32_t val_1;
  uint32_t carry_1;
  uint32_t i_1;
  uint32_t mul;
  uint32_t mask;
  uint32_t val;
  uint32_t carry;
  uint32_t i;
  int32_t floorlog10;
  int32_t floorlog2;
  uint32_t s;
  uint32_t stop2;
  uint32_t stop1;
  uint32_t ndlo;
  SFormat sf_local;
  uint32_t k_local;
  uint32_t ndhi_local;
  uint32_t *nd_local;
  
  ndlo = 0;
  stop1 = 0xffffffff;
  stop2 = 0xffffffff;
  k_local = k;
  if (ndhi == 0) {
    if (*nd == 0) {
      return 0;
    }
    uVar3 = 0;
    for (uVar1 = *nd; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x80000000) {
      uVar3 = uVar3 + 1;
    }
    if (k <= uVar3) {
      *nd = *nd >> ((byte)k & 0x1f);
      return 0;
    }
    *nd = *nd >> ((byte)uVar3 & 0x1f);
    k_local = k - uVar3;
  }
  ndhi_local = ndhi;
  if (0x12 < k_local) {
    if ((sf >> 4 & 3) == 2) {
      stop1 = 0x3f - (int)((sf >> 0x18) - 1) / 9;
    }
    else {
      iVar2 = 0x1f;
      if (nd[ndhi] != 0) {
        for (; nd[ndhi] >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      stop1 = (int)((int)((double)(int)((ndhi * 0x1d + iVar2) - k_local) * 0.30102999566398114) -
                   ((sf >> 0x18) - 1)) / 9 + 0x3e;
      stop2 = (ndhi + 0x3d) - (int)((sf >> 0x18) - 1) / 8;
    }
  }
  do {
    if (k_local < 9) {
      if (k_local != 0) {
        bVar4 = (byte)k_local;
        i_1 = ndhi_local;
        carry_1 = 0;
        while( true ) {
          uVar1 = nd[i_1];
          nd[i_1] = (uVar1 >> (bVar4 & 0x1f)) + carry_1;
          carry_1 = (uVar1 & (1 << (bVar4 & 0x1f)) - 1U) * (1000000000 >> (bVar4 & 0x1f));
          if (i_1 == ndlo) break;
          i_1 = i_1 - 1 & 0x3f;
        }
        if (carry_1 != 0) {
          ndlo = ndlo - 1 & 0x3f;
          nd[ndlo] = carry_1;
        }
      }
      return ndlo;
    }
    i = ndhi_local;
    carry = 0;
    while( true ) {
      uVar1 = nd[i];
      nd[i] = (uVar1 >> 9) + carry;
      carry = (uVar1 & 0x1ff) * 0x1dcd65;
      if (i == ndlo) break;
      i = i - 1 & 0x3f;
    }
    if ((ndlo == stop1) || (ndlo == stop2)) {
      if (nd[ndhi_local] == 0) {
        if (ndhi_local == ndlo) {
          return ndlo;
        }
        ndhi_local = ndhi_local - 1 & 0x3f;
        stop2 = stop2 - 1;
      }
    }
    else {
      if (carry != 0) {
        ndlo = ndlo - 1 & 0x3f;
        nd[ndlo] = carry;
      }
      if (nd[ndhi_local] == 0) {
        ndhi_local = ndhi_local - 1 & 0x3f;
        stop2 = stop2 - 1;
      }
    }
    k_local = k_local - 9;
  } while( true );
}

Assistant:

static uint32_t nd_div2k(uint32_t* nd, uint32_t ndhi, uint32_t k, SFormat sf)
{
  uint32_t ndlo = 0, stop1 = ~0, stop2 = ~0;
  /* Performance hacks. */
  if (!ndhi) {
    if (!nd[0]) {
      return 0;
    } else {
      uint32_t s = lj_ffs(nd[0]);
      if (s >= k) { nd[0] >>= k; return 0; }
      nd[0] >>= s; k -= s;
    }
  }
  if (k > 18) {
    if (STRFMT_FP(sf) == STRFMT_FP(STRFMT_T_FP_F)) {
      stop1 = 63 - (int32_t)STRFMT_PREC(sf) / 9;
    } else {
      int32_t floorlog2 = ndhi * 29 + lj_fls(nd[ndhi]) - k;
      int32_t floorlog10 = (int32_t)(floorlog2 * 0.30102999566398114);
      stop1 = 62 + (floorlog10 - (int32_t)STRFMT_PREC(sf)) / 9;
      stop2 = 61 + ndhi - (int32_t)STRFMT_PREC(sf) / 8;
    }
  }
  /* Real logic. */
  while (k >= 9) {
    uint32_t i = ndhi, carry = 0;
    for (;;) {
      uint32_t val = nd[i];
      nd[i] = (val >> 9) + carry;
      carry = (val & 0x1ff) * 1953125;
      if (i == ndlo) break;
      i = (i - 1) & 0x3f;
    }
    if (ndlo != stop1 && ndlo != stop2) {
      if (carry) { ndlo = (ndlo - 1) & 0x3f; nd[ndlo] = carry; }
      if (!nd[ndhi]) { ndhi = (ndhi - 1) & 0x3f; stop2--; }
    } else if (!nd[ndhi]) {
      if (ndhi != ndlo) { ndhi = (ndhi - 1) & 0x3f; stop2--; }
      else return ndlo;
    }
    k -= 9;
  }
  if (k) {
    uint32_t mask = (1U << k) - 1, mul = 1000000000 >> k, i = ndhi, carry = 0;
    for (;;) {
      uint32_t val = nd[i];
      nd[i] = (val >> k) + carry;
      carry = (val & mask) * mul;
      if (i == ndlo) break;
      i = (i - 1) & 0x3f;
    }
    if (carry) { ndlo = (ndlo - 1) & 0x3f; nd[ndlo] = carry; }
  }
  return ndlo;
}